

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O2

void AddContent(QuadTreeNode *Tree,Container *NewContent,int divider)

{
  undefined8 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  Container *pCVar8;
  QuadTreeNode *pQVar9;
  long lVar10;
  Container *pCVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar6 = Separated(&((NewContent->Content).E)->Bounder,&Tree->Bounder);
  if (iVar6 == 0) {
    if (Tree->Children == (QuadTreeNode *)0x0) {
      iVar6 = Tree->NumContents + 1;
      Tree->NumContents = iVar6;
      pCVar11 = Tree->Contents;
      pCVar8 = (Container *)malloc(0x18);
      Tree->Contents = pCVar8;
      pCVar8->Content = NewContent->Content;
      pCVar8->Type = NewContent->Type;
      pCVar8->Next = pCVar11;
      if (((iVar6 == divider) &&
          ((double)screen_width < (Tree->Bounder).BR.Pos[0] - (Tree->Bounder).TL.Pos[0])) &&
         ((double)screen_height < (Tree->Bounder).BR.Pos[1] - (Tree->Bounder).TL.Pos[1])) {
        pQVar9 = (QuadTreeNode *)malloc(0x120);
        Tree->Children = pQVar9;
        uVar7 = 3;
        bVar5 = 1;
        for (lVar10 = 0; lVar10 != -0x120; lVar10 = lVar10 + -0x48) {
          dVar14 = (Tree->Bounder).TL.Pos[0];
          dVar4 = dVar14;
          if ((bool)(bVar5 & 1)) {
            dVar4 = ((Tree->Bounder).BR.Pos[0] + dVar14) * 0.5;
          }
          dVar2 = (Tree->Bounder).TL.Pos[1];
          dVar12 = dVar2;
          if ((uVar7 & 2) != 0) {
            dVar12 = ((Tree->Bounder).BR.Pos[1] + dVar2) * 0.5;
          }
          dVar13 = (Tree->Bounder).BR.Pos[0];
          if (bVar5 == 0) {
            dVar13 = (dVar14 + dVar13) * 0.5;
          }
          dVar14 = (Tree->Bounder).BR.Pos[1];
          if ((uVar7 & 2) == 0) {
            dVar14 = (dVar2 + dVar14) * 0.5;
          }
          pQVar9 = Tree->Children;
          *(double *)((long)pQVar9[3].Bounder.TL.Pos + lVar10) = (double)(int)dVar4;
          auVar3._8_4_ = SUB84((double)(int)dVar13,0);
          auVar3._0_8_ = (double)(int)dVar12;
          auVar3._12_4_ = (int)((ulong)(double)(int)dVar13 >> 0x20);
          *(undefined1 (*) [16])((long)pQVar9[3].Bounder.TL.Pos + lVar10 + 8) = auVar3;
          *(double *)((long)pQVar9[3].Bounder.BR.Pos + lVar10 + 8) = (double)(int)dVar14;
          *(undefined4 *)((long)(&pQVar9[3].Bounder + 1) + lVar10) = 0;
          *(undefined8 *)((long)(&pQVar9[3].Bounder + 1) + lVar10 + 0x18) = 0;
          puVar1 = (undefined8 *)((long)(&pQVar9[3].Bounder + 1) + lVar10 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          uVar7 = uVar7 - 1;
          bVar5 = bVar5 + 1;
        }
        pCVar11 = Tree->Contents;
        while (pCVar11 != (Container *)0x0) {
          pCVar8 = pCVar11->Next;
          for (lVar10 = 0xd8; lVar10 != -0x48; lVar10 = lVar10 + -0x48) {
            AddContent((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar10),pCVar11,
                       divider);
          }
          free(pCVar11);
          pCVar11 = pCVar8;
        }
        Tree->Contents = (Container *)0x0;
      }
    }
    else {
      for (lVar10 = 0xd8; lVar10 != -0x48; lVar10 = lVar10 + -0x48) {
        AddContent((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar10),NewContent,
                   divider);
      }
    }
  }
  return;
}

Assistant:

static void AddContent(struct QuadTreeNode *Tree, struct Container *NewContent,
                int divider)
{
   int c;
   struct Container *CPtr, *Next;

   /*

      First check: does the refered new content actually overlap with this
      node? If not, do nothing

      NB: this code explicitly checks the bounding box of an 'edge' held in
      NewContent, even though it may hold an edge, triangle or object. This is
      fine because we've set up our structs so that the bounding box
      information is at the same location regardless

    */
   if (Separated(&NewContent->Content.E->Bounder, &Tree->Bounder))
      return;

   /*

      Second check: has this node been subdivided? If so, pass on for
      children to deal with

    */
   if (Tree->Children) {
      c = 4;
      while (c--)
         AddContent(&Tree->Children[c], NewContent, divider);
   } else {
      /*

         If we're here, then the edge really does need to be added to the
         current node, so do that

       */
      Tree->NumContents++;
      CPtr = Tree->Contents;
      Tree->Contents = (struct Container *)malloc(sizeof(struct Container));
      Tree->Contents->Content = NewContent->Content;
      Tree->Contents->Type = NewContent->Type;
      Tree->Contents->Next = CPtr;

      /*

         Now check if we've hit the maximum content count for this node. If
         so, subdivide

       */
      if ((Tree->NumContents == divider)
          && ((Tree->Bounder.BR.Pos[0] - Tree->Bounder.TL.Pos[0]) > screen_width)
          && ((Tree->Bounder.BR.Pos[1] - Tree->Bounder.TL.Pos[1]) > screen_height)) {
         /* allocate new memory and set up structures */
         Tree->Children =
            (struct QuadTreeNode *)malloc(sizeof(struct QuadTreeNode)
                                          * 4);
         c = 4;
         while (c--)
            SetupQuadTree(&Tree->Children[c],
                          GetX1(c, &Tree->Bounder), GetY1(c,
                                                          &Tree->
                                                          Bounder),
                          GetX2(c, &Tree->Bounder), GetY2(c, &Tree->Bounder));

         /* redistribute contents currently stored here */
         CPtr = Tree->Contents;
         while (CPtr) {
            Next = CPtr->Next;

            c = 4;
            while (c--)
               AddContent(&Tree->Children[c], CPtr, divider);

            free(CPtr);
            CPtr = Next;
         }
         Tree->Contents = NULL;
      }
   }
}